

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collection.cpp
# Opt level: O2

int arangodb::velocypack::Collection::remove(char *__filename)

{
  _Alloc_hider _Var1;
  const_iterator cVar2;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *in_RDX;
  Slice in_RSI;
  string_view attrName;
  Slice local_78;
  ObjectIterator it;
  string key;
  string *psVar3;
  
  Builder::Builder((Builder *)__filename);
  Value::Value((Value *)&it,Object,false);
  Builder::addInternal<arangodb::velocypack::Value>((Builder *)__filename,(Value *)&it);
  ObjectIterator::ObjectIterator(&it,in_RSI,false);
  while (it._position != it._size) {
    local_78 = ObjectIterator::key(&it,true);
    SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::copyString_abi_cxx11_
              (&key,(SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)&local_78)
    ;
    in_RSI._start = (uint8_t *)&key;
    cVar2 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(in_RDX,&key);
    psVar3 = (string *)key._M_string_length;
    _Var1 = key._M_dataplus;
    if (cVar2.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_78 = ObjectIterator::value(&it);
      attrName._M_str = _Var1._M_p;
      attrName._M_len = (size_t)psVar3;
      Builder::addInternal<arangodb::velocypack::Slice>((Builder *)__filename,attrName,&local_78);
      in_RSI._start = (uint8_t *)psVar3;
    }
    ObjectIterator::next(&it);
    std::__cxx11::string::~string((string *)&key);
  }
  Builder::close((Builder *)__filename,(int)in_RSI._start);
  return (int)__filename;
}

Assistant:

Builder Collection::remove(Slice slice,
                           std::unordered_set<std::string> const& keys) {
  Builder b;
  b.add(Value(ValueType::Object));

  ObjectIterator it(slice, /*useSequentialIteration*/ false);

  while (it.valid()) {
    auto key = it.key(true).copyString();
    if (keys.find(key) == keys.end()) {
      b.add(key, it.value());
    }
    it.next();
  }

  b.close();
  return b;
}